

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O2

Vector<float,_2> __thiscall
deqp::gles2::Functional::safeCoords<2>
          (Functional *this,Vector<float,_2> *raw,Vector<int,_2> *scale,Vector<float,_2> *fraction)

{
  float fVar1;
  int iVar2;
  Vector<float,_2> VVar3;
  int i;
  long lVar4;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float extraout_XMM0_Db;
  float __x;
  
  *(undefined8 *)this = 0;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    fVar1 = fraction->m_data[lVar4];
    iVar2 = scale->m_data[lVar4];
    __x = (raw->m_data[lVar4] * (float)iVar2 + 0.5) - fVar1;
    in_XMM0_Da = floorf(__x);
    *(float *)(this + lVar4 * 4) =
         ((__x - in_XMM0_Da) * 0.5 + in_XMM0_Da + 0.25 + -0.5 + fVar1) / (float)iVar2;
    in_XMM0_Db = extraout_XMM0_Db;
  }
  VVar3.m_data[1] = in_XMM0_Db;
  VVar3.m_data[0] = in_XMM0_Da;
  return (Vector<float,_2>)VVar3.m_data;
}

Assistant:

static inline tcu::Vector<float, Size> safeCoords (const tcu::Vector<float, Size>& raw, const tcu::Vector<int, Size>& scale, const tcu::Vector<float, Size>& fraction)
{
	tcu::Vector<float, Size> result;
	for (int i = 0; i < Size; i++)
		result[i] = safeCoord(raw[i], scale[i], fraction[i]);
	return result;
}